

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

int clampvar(ident *id,int val,int minval,int maxval)

{
  char *fmt;
  int iVar1;
  char *pcVar2;
  
  iVar1 = minval;
  if ((val < minval) || (iVar1 = maxval, maxval < val)) {
    pcVar2 = "valid range for %s is 0x%X..0x%X";
    if (minval < 0x100) {
      pcVar2 = "valid range for %s is %d..0x%X";
    }
    fmt = "valid range for %s is %d..%d";
    if ((id->flags & 4) != 0) {
      fmt = pcVar2;
    }
    debugcode(fmt,id->name);
    val = iVar1;
  }
  return val;
}

Assistant:

int clampvar(ident *id, int val, int minval, int maxval)
{
    if(val < minval) val = minval;
    else if(val > maxval) val = maxval;
    else return val;
    debugcode(id->flags&IDF_HEX ?
            (minval <= 255 ? "valid range for %s is %d..0x%X" : "valid range for %s is 0x%X..0x%X") :
            "valid range for %s is %d..%d",
        id->name, minval, maxval);
    return val;
}